

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ManPrintQuit(Mf_Man_t *p,Gia_Man_t *pNew)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  double dVar6;
  double dVar7;
  double local_38;
  uint local_30;
  int i;
  float MemMap;
  float MemTt;
  float MemCuts;
  float MemMan;
  float MemGia;
  Gia_Man_t *pNew_local;
  Mf_Man_t *p_local;
  
  dVar6 = Gia_ManMemory(p->pGia);
  iVar3 = Gia_ManObjNum(p->pGia);
  fVar1 = ((float)iVar3 * 16.0) / 1048576.0;
  iVar3 = Vec_PtrSize(&p->vPages);
  fVar2 = ((float)iVar3 * 262144.0) / 1048576.0;
  if (p->vTtMem == (Vec_Mem_t *)0x0) {
    local_38 = 0.0;
  }
  else {
    local_38 = Vec_MemMemory(p->vTtMem);
    local_38 = local_38 / 1048576.0;
  }
  dVar7 = Vec_IntMemory(pNew->vMapping);
  if ((p->CutCount[0] == 0.0) && (!NAN(p->CutCount[0]))) {
    p->CutCount[0] = 1.0;
  }
  if (p->pPars->fVerbose != 0) {
    printf("CutPair = %.0f  ",p->CutCount[0]);
    printf("Merge = %.0f (%.2f %%)  ",p->CutCount[1],(p->CutCount[1] * 100.0) / p->CutCount[0]);
    printf("Eval = %.0f (%.2f %%)  ",p->CutCount[2],(p->CutCount[2] * 100.0) / p->CutCount[0]);
    printf("Cut = %.0f (%.2f %%)  ",p->CutCount[3],(p->CutCount[3] * 100.0) / p->CutCount[0]);
    printf("\n");
    printf("Gia = %.2f MB  ",(double)(float)(dVar6 / 1048576.0));
    printf("Man = %.2f MB  ",(double)fVar1);
    printf("Cut = %.2f MB   ",(double)fVar2);
    printf("Map = %.2f MB  ",(double)(float)(dVar7 / 1048576.0));
    printf("TT = %.2f MB  ",(double)(float)local_38);
    printf("Total = %.2f MB",
           (double)((float)(dVar6 / 1048576.0) + fVar1 + fVar2 + (float)(dVar7 / 1048576.0) +
                   (float)local_38));
    printf("\n");
    for (local_30 = 0; (int)local_30 <= p->pPars->nLutSize; local_30 = local_30 + 1) {
      printf("%d = %d  ",(ulong)local_30,(ulong)(uint)p->nCutCounts[(int)local_30]);
    }
    if (p->vTtMem != (Vec_Mem_t *)0x0) {
      uVar4 = Vec_MemEntryNum(p->vTtMem);
      iVar3 = Vec_MemEntryNum(p->vTtMem);
      printf("TT = %d (%.2f %%)  ",((double)iVar3 * 100.0) / p->CutCount[2],(ulong)uVar4);
    }
    aVar5 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar5 - p->clkStart);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Mf_ManPrintQuit( Mf_Man_t * p, Gia_Man_t * pNew )
{
    float MemGia   = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan   = 1.0 * sizeof(Mf_Obj_t) * Gia_ManObjNum(p->pGia) / (1<<20);
    float MemCuts  = 1.0 * sizeof(int) * (1 << 16) * Vec_PtrSize(&p->vPages) / (1<<20);
    float MemTt    = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    float MemMap   = Vec_IntMemory(pNew->vMapping) / (1<<20);
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
        return;
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.2f %%)  ", p->CutCount[1], 100.0*p->CutCount[1]/p->CutCount[0] );
    printf( "Eval = %.0f (%.2f %%)  ",  p->CutCount[2], 100.0*p->CutCount[2]/p->CutCount[0] );
    printf( "Cut = %.0f (%.2f %%)  ",   p->CutCount[3], 100.0*p->CutCount[3]/p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Cut = %.2f MB   ",         MemCuts );
    printf( "Map = %.2f MB  ",          MemMap ); 
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB",          MemGia + MemMan + MemCuts + MemMap + MemTt ); 
    printf( "\n" );
    if ( 1 )
    {
        int i;
        for ( i = 0; i <= p->pPars->nLutSize; i++ )
            printf( "%d = %d  ", i, p->nCutCounts[i] );
        if ( p->vTtMem )
            printf( "TT = %d (%.2f %%)  ", Vec_MemEntryNum(p->vTtMem), 100.0 * Vec_MemEntryNum(p->vTtMem) / p->CutCount[2] );
        Abc_PrintTime( 1, "Time",    Abc_Clock() - p->clkStart );
    }
    fflush( stdout );
}